

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall FPlayerNameBox::MenuEvent(FPlayerNameBox *this,int mkey,bool fromcontroller)

{
  DTextEnterMenu *this_00;
  char *__src;
  float volume;
  DMenu *input;
  byte local_1d;
  int local_1c;
  bool fromcontroller_local;
  FPlayerNameBox *pFStack_18;
  int mkey_local;
  FPlayerNameBox *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pFStack_18 = this;
  if (mkey == 6) {
    FSoundID::FSoundID((FSoundID *)((long)&input + 4),"menu/choose");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,(FSoundID *)((long)&input + 4),volume,0.0);
    __src = this->mPlayerName;
    strcpy(this->mEditName,__src);
    this->mEntering = true;
    this_00 = (DTextEnterMenu *)DObject::operator_new((DObject *)0x58,(size_t)__src);
    DTextEnterMenu::DTextEnterMenu
              (this_00,DMenu::CurrentMenu,this->mEditName,0xf,2,(bool)(local_1d & 1),false);
    M_ActivateMenu((DMenu *)this_00);
    this_local._7_1_ = true;
  }
  else if (mkey == 10) {
    strcpy(this->mPlayerName,this->mEditName);
    this->mEntering = false;
    this_local._7_1_ = true;
  }
  else if (mkey == 0xb) {
    this->mEntering = false;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FPlayerNameBox::MenuEvent(int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		strcpy(mEditName, mPlayerName);
		mEntering = true;
		DMenu *input = new DTextEnterMenu(DMenu::CurrentMenu, mEditName, MAXPLAYERNAME, 2, fromcontroller);
		M_ActivateMenu(input);
		return true;
	}
	else if (mkey == MKEY_Input)
	{
		strcpy(mPlayerName, mEditName);
		mEntering = false;
		return true;
	}
	else if (mkey == MKEY_Abort)
	{
		mEntering = false;
		return true;
	}
	return false;
}